

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

complex<long_double> * __thiscall
TPZMatrix<std::complex<long_double>_>::ConditionNumber
          (complex<long_double> *__return_storage_ptr__,TPZMatrix<std::complex<long_double>_> *this,
          int p,int64_t numiter,REAL tol)

{
  int iVar1;
  complex<long_double> thisnorm;
  complex<long_double> invnorm;
  TPZFMatrix<std::complex<long_double>_> Inv;
  complex<long_double> local_108;
  complex<long_double> local_e8;
  TPZFMatrix<std::complex<long_double>_> local_c0;
  
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  local_c0.fElem = (complex<long_double> *)0x0;
  local_c0.fGiven = (complex<long_double> *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  local_c0.fWork.fStore = (complex<long_double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  MatrixNorm(&local_108,this,p,numiter,tol);
  iVar1 = Inverse(this,&local_c0,ENoDecompose);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<std::complex<long double>>::ConditionNumber(int, int64_t, REAL) [T = std::complex<long double>]"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," - it was not possible to compute the inverse matrix.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    *(longdouble *)__return_storage_ptr__->_M_value = (longdouble)0;
    *(longdouble *)(__return_storage_ptr__->_M_value + 0x10) = (longdouble)0;
  }
  else {
    MatrixNorm(&local_e8,&local_c0.super_TPZMatrix<std::complex<long_double>_>,p,numiter,tol);
    *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = local_108._M_value._16_8_;
    *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = local_108._M_value._24_8_;
    *(undefined8 *)__return_storage_ptr__->_M_value = local_108._M_value._0_8_;
    *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = local_108._M_value._8_8_;
    std::complex<long_double>::operator*=(__return_storage_ptr__,&local_e8);
  }
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}